

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nested_functions.cpp
# Opt level: O2

void duckdb::MapUtil::ReinterpretMap(Vector *result,Vector *input,idx_t count)

{
  VectorType vector_type_p;
  Vector *pVVar1;
  idx_t size;
  Vector *pVVar2;
  UnifiedVectorFormat input_struct_data;
  UnifiedVectorFormat input_data;
  UnifiedVectorFormat local_b0;
  UnifiedVectorFormat local_68;
  
  UnifiedVectorFormat::UnifiedVectorFormat(&local_68);
  Vector::ToUnifiedFormat(input,count,&local_68);
  FlatVector::SetValidity(result,&local_68.validity);
  UnifiedVectorFormat::UnifiedVectorFormat(&local_b0);
  pVVar1 = ListVector::GetEntry(input);
  Vector::ToUnifiedFormat(pVVar1,count,&local_b0);
  pVVar1 = ListVector::GetEntry(result);
  FlatVector::SetValidity(pVVar1,&local_b0.validity);
  size = ListVector::GetListSize(input);
  ListVector::SetListSize(result,size);
  Vector::CopyBuffer(result,input);
  pVVar1 = MapVector::GetKeys(input);
  pVVar2 = MapVector::GetKeys(result);
  Vector::Reference(pVVar2,pVVar1);
  pVVar1 = MapVector::GetValues(input);
  pVVar2 = MapVector::GetValues(result);
  Vector::Reference(pVVar2,pVVar1);
  vector_type_p = input->vector_type;
  if (vector_type_p == DICTIONARY_VECTOR) {
    Vector::Slice(result,local_68.sel,count);
    vector_type_p = input->vector_type;
  }
  Vector::SetVectorType(result,vector_type_p);
  UnifiedVectorFormat::~UnifiedVectorFormat(&local_b0);
  UnifiedVectorFormat::~UnifiedVectorFormat(&local_68);
  return;
}

Assistant:

void MapUtil::ReinterpretMap(Vector &result, Vector &input, idx_t count) {
	UnifiedVectorFormat input_data;
	input.ToUnifiedFormat(count, input_data);
	// Copy the list validity
	FlatVector::SetValidity(result, input_data.validity);

	// Copy the struct validity
	UnifiedVectorFormat input_struct_data;
	ListVector::GetEntry(input).ToUnifiedFormat(count, input_struct_data);
	auto &result_struct = ListVector::GetEntry(result);
	FlatVector::SetValidity(result_struct, input_struct_data.validity);

	// Copy the list size
	auto list_size = ListVector::GetListSize(input);
	ListVector::SetListSize(result, list_size);

	// Copy the list buffer (the list_entry_t data)
	result.CopyBuffer(input);

	auto &input_keys = MapVector::GetKeys(input);
	auto &result_keys = MapVector::GetKeys(result);
	result_keys.Reference(input_keys);

	auto &input_values = MapVector::GetValues(input);
	auto &result_values = MapVector::GetValues(result);
	result_values.Reference(input_values);

	if (input.GetVectorType() == VectorType::DICTIONARY_VECTOR) {
		result.Slice(*input_data.sel, count);
	}

	// Set the right vector type
	result.SetVectorType(input.GetVectorType());
}